

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kcpu.c
# Opt level: O1

void m68k_pulse_reset(void)

{
  m68ki_cpu.pmmu_enabled = 0;
  m68ki_cpu.stopped = 0;
  m68ki_remaining_cycles = 0;
  m68ki_cpu.instr_mode = 0;
  m68ki_cpu.run_mode = 2;
  m68ki_cpu.t1_flag = 0;
  m68ki_cpu.t0_flag = 0;
  m68ki_cpu.int_mask = 0x700;
  m68ki_cpu.int_level = 0;
  m68ki_cpu.virq_state = 0;
  m68ki_cpu.vbr = 0;
  m68ki_cpu.sp[m68ki_cpu.s_flag >> 1 & m68ki_cpu.m_flag | m68ki_cpu.s_flag] = m68ki_cpu.dar[0xf];
  m68ki_cpu.s_flag = 4;
  m68ki_cpu.m_flag = 0;
  m68ki_cpu.dar[0xf] = m68ki_cpu.sp[4];
  m68ki_cpu.pc = 0;
  m68ki_cpu.dar[0xf] = read_sp_on_reset();
  m68ki_cpu.pc = read_pc_on_reset();
  m68ki_cpu._396_8_ = m68ki_cpu._396_8_ & 0xffffffff;
  m68ki_cpu.reset_cycles = (uint)*m68ki_cpu.cyc_exception;
  return;
}

Assistant:

void m68k_pulse_reset(void)
{
	/* Disable the PMMU on reset */
	m68ki_cpu.pmmu_enabled = 0;

	/* Clear all stop levels and eat up all remaining cycles */
	CPU_STOPPED = 0;
	SET_CYCLES(0);

	CPU_RUN_MODE = RUN_MODE_BERR_AERR_RESET;
	CPU_INSTR_MODE = INSTRUCTION_YES;

	/* Turn off tracing */
	FLAG_T1 = FLAG_T0 = 0;
	m68ki_clear_trace();
	/* Interrupt mask to level 7 */
	FLAG_INT_MASK = 0x0700;
	CPU_INT_LEVEL = 0;
	m68ki_cpu.virq_state = 0;
	/* Reset VBR */
	REG_VBR = 0;
	/* Go to supervisor mode */
	m68ki_set_sm_flag(SFLAG_SET | MFLAG_CLEAR);

	/* Invalidate the prefetch queue */
#if M68K_EMULATE_PREFETCH
	/* Set to arbitrary number since our first fetch is from 0 */
	CPU_PREF_ADDR = 0x1000;
#endif /* M68K_EMULATE_PREFETCH */

	/* Read the initial stack pointer and program counter */
	m68ki_jump(0);
	// REG_SP = m68ki_read_imm_32();
	// REG_PC = m68ki_read_imm_32();
    REG_SP = read_sp_on_reset();
    REG_PC = read_pc_on_reset();

	m68ki_jump(REG_PC);

	CPU_RUN_MODE = RUN_MODE_NORMAL;

	RESET_CYCLES = CYC_EXCEPTION[EXCEPTION_RESET];
}